

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O0

string * Vault::operator+(string *__return_storage_ptr__,char *string,
                         Tiny<Vault::AlgorithmDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *tiny)

{
  string local_40;
  Tiny<Vault::AlgorithmDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  Tiny<Vault::AlgorithmDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *tiny_local;
  char *string_local;
  
  local_20 = tiny;
  tiny_local = (Tiny<Vault::AlgorithmDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)string;
  string_local = (char *)__return_storage_ptr__;
  Tiny<Vault::AlgorithmDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::toString(&local_40,tiny);
  std::operator+(__return_storage_ptr__,string,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string operator+(const char *string, const Tiny &tiny) {
    return string + tiny.toString();
  }